

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcnn.cpp
# Opt level: O1

VectorXd __thiscall CppCNN::flatten_layer(CppCNN *this,LayerValues *input)

{
  ulong uVar1;
  double *pdVar2;
  DenseStorage<double,__1,__1,__1,_0> *pDVar3;
  element_type *peVar4;
  double dVar5;
  Index size;
  ulong uVar6;
  long *in_RDX;
  long lVar7;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index IVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  DenseStorage<double,__1,__1,__1,_0> *other;
  VectorXd VVar13;
  MatrixXd c_value;
  DenseStorage<double,__1,__1,__1,_0> local_40;
  
  lVar7 = *in_RDX;
  lVar7 = (in_RDX[1] - lVar7 >> 3) * -0x5555555555555555 *
          *(long *)(lVar7 + 0x10) * *(long *)(lVar7 + 8);
  (this->super_enable_shared_from_this<CppCNN>)._M_weak_this.
  super___weak_ptr<CppCNN,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<CppCNN>)._M_weak_this.
  super___weak_ptr<CppCNN,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (lVar7 < 0) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/PlainObjectBase.h"
                  ,0x138,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)this,lVar7,lVar7,1);
  other = (DenseStorage<double,__1,__1,__1,_0> *)*in_RDX;
  pDVar3 = (DenseStorage<double,__1,__1,__1,_0> *)in_RDX[1];
  IVar8 = extraout_RDX;
  if (other != pDVar3) {
    uVar12 = 0;
    do {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_40,other);
      Eigen::internal::
      inplace_transpose_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false,_false>::run
                ((Matrix<double,__1,__1,_0,__1,__1> *)&local_40);
      lVar7 = other->m_cols * other->m_rows;
      if (lVar7 < 0) {
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/PlainObjectBase.h"
                      ,0x11d,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                     );
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_40,lVar7,lVar7,1);
      uVar6 = local_40.m_rows * local_40.m_cols;
      peVar4 = (this->super_enable_shared_from_this<CppCNN>)._M_weak_this.
               super___weak_ptr<CppCNN,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((long)uVar6 < 0 && peVar4 != (element_type *)0x0) {
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/MapBase.h"
                      ,0xb0,
                      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                     );
      }
      if (((long)(uVar6 | uVar12) < 0) ||
         ((long)((long)(this->super_enable_shared_from_this<CppCNN>)._M_weak_this.
                       super___weak_ptr<CppCNN,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi -
                uVar6) < (long)uVar12)) {
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/Block.h"
                      ,0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      if (local_40.m_cols != 1) {
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow to resize.\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/DenseBase.h"
                      ,0x101,
                      "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>]"
                     );
      }
      uVar1 = (long)&(peVar4->super_enable_shared_from_this<CppCNN>)._M_weak_this.
                     super___weak_ptr<CppCNN,_(__gnu_cxx::_Lock_policy)2> + uVar12 * 8;
      uVar9 = uVar6;
      if (((uVar1 & 7) == 0) &&
         (uVar9 = (ulong)((uint)(uVar1 >> 3) & 1), (long)uVar6 <= (long)uVar9)) {
        uVar9 = uVar6;
      }
      if (0 < (long)uVar9) {
        uVar10 = 0;
        do {
          *(double *)(uVar1 + uVar10 * 8) = local_40.m_data[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      lVar11 = uVar6 - uVar9;
      lVar7 = (lVar11 - (lVar11 >> 0x3f) & 0xfffffffffffffffeU) + uVar9;
      if (1 < lVar11) {
        do {
          dVar5 = (local_40.m_data + uVar9)[1];
          pdVar2 = (double *)(uVar1 + uVar9 * 8);
          *pdVar2 = local_40.m_data[uVar9];
          pdVar2[1] = dVar5;
          uVar9 = uVar9 + 2;
        } while ((long)uVar9 < lVar7);
      }
      if (lVar7 < (long)uVar6) {
        do {
          *(double *)(uVar1 + lVar7 * 8) = local_40.m_data[lVar7];
          lVar7 = lVar7 + 1;
        } while (uVar6 - lVar7 != 0);
      }
      uVar12 = uVar12 + local_40.m_rows;
      free(local_40.m_data);
      other = other + 1;
      IVar8 = extraout_RDX_00;
    } while (other != pDVar3);
  }
  VVar13.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar8;
  VVar13.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar13.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd CppCNN::flatten_layer(const LayerValues& input) {
	VectorXd v_flatten(input[0].size() * input.size());
	Index start = 0;
	for (auto& c : input) {
		MatrixXd c_value = c;
		c_value.transposeInPlace();
		c_value.resize(c.size(), 1);
		v_flatten.segment(start, c_value.size())= c_value;
		start += c_value.size();
	}
	return v_flatten;
}